

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O0

UnicodeString * __thiscall
icu_63::Normalizer2WithImpl::normalize
          (Normalizer2WithImpl *this,UnicodeString *src,UnicodeString *dest,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UBool UVar2;
  uint uVar3;
  int iVar4;
  int32_t iVar5;
  UnicodeString *__filename;
  undefined1 local_78 [8];
  ReorderingBuffer buffer;
  UChar *sArray;
  UErrorCode *errorCode_local;
  UnicodeString *dest_local;
  UnicodeString *src_local;
  Normalizer2WithImpl *this_local;
  
  __filename = src;
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    buffer.codePointLimit = UnicodeString::getBuffer(src);
    if ((dest == src) || (buffer.codePointLimit == (char16_t *)0x0)) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      UnicodeString::setToBogus(dest);
    }
    else {
      UnicodeString::remove(dest,(char *)__filename);
      ReorderingBuffer::ReorderingBuffer((ReorderingBuffer *)local_78,this->impl,dest);
      uVar3 = UnicodeString::length(src);
      iVar4 = ReorderingBuffer::init((ReorderingBuffer *)local_78,(EVP_PKEY_CTX *)(ulong)uVar3);
      pUVar1 = buffer.codePointLimit;
      if ((char)iVar4 != '\0') {
        iVar5 = UnicodeString::length(src);
        (*(this->super_Normalizer2).super_UObject._vptr_UObject[0x12])
                  (this,pUVar1,pUVar1 + iVar5,local_78,errorCode);
      }
      ReorderingBuffer::~ReorderingBuffer((ReorderingBuffer *)local_78);
    }
  }
  else {
    UnicodeString::setToBogus(dest);
  }
  return dest;
}

Assistant:

virtual UnicodeString &
    normalize(const UnicodeString &src,
              UnicodeString &dest,
              UErrorCode &errorCode) const {
        if(U_FAILURE(errorCode)) {
            dest.setToBogus();
            return dest;
        }
        const UChar *sArray=src.getBuffer();
        if(&dest==&src || sArray==NULL) {
            errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            dest.setToBogus();
            return dest;
        }
        dest.remove();
        ReorderingBuffer buffer(impl, dest);
        if(buffer.init(src.length(), errorCode)) {
            normalize(sArray, sArray+src.length(), buffer, errorCode);
        }
        return dest;
    }